

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall
p2t::Sweep::FillRightConvexEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Orientation OVar1;
  Node *node_local;
  Edge *edge_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  OVar1 = Orient2d(node->next->point,node->next->next->point,node->next->next->next->point);
  if (OVar1 == CCW) {
    FillRightConcaveEdgeEvent(this,tcx,edge,node->next);
  }
  else {
    OVar1 = Orient2d(edge->q,node->next->next->point,edge->p);
    if (OVar1 == CCW) {
      FillRightConvexEdgeEvent(this,tcx,edge,node->next);
    }
  }
  return;
}

Assistant:

void Sweep::FillRightConvexEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  // Next concave or convex?
  if (Orient2d(*node.next->point, *node.next->next->point, *node.next->next->next->point) == CCW) {
    // Concave
    FillRightConcaveEdgeEvent(tcx, edge, *node.next);
  } else{
    // Convex
    // Next above or below edge?
    if (Orient2d(*edge->q, *node.next->next->point, *edge->p) == CCW) {
      // Below
      FillRightConvexEdgeEvent(tcx, edge, *node.next);
    } else{
      // Above
    }
  }
}